

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O0

Iterator __thiscall
Map<String,_String>::insert
          (Map<String,_String> *this,Item **cell,Item *parent,String *key,String *value)

{
  usize uVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  ItemBlock *pIVar5;
  Item *pIVar6;
  String *local_80;
  usize oldHeight;
  Item *insertPos;
  Item *end;
  Item *i;
  ItemBlock *itemBlock;
  Item *item;
  Item *position;
  String *value_local;
  String *key_local;
  Item *parent_local;
  Item **cell_local;
  Map<String,_String> *this_local;
  
  key_local = &parent->key;
  parent_local = (Item *)cell;
  while( true ) {
    if ((((key_local != (String *)0x0) && (parent_local != (Item *)&key_local[2]._data)) &&
        (parent_local != (Item *)&key_local[2]._data.len)) &&
       (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,0x188,"!parent || cell == &parent->left || cell == &parent->right"),
       iVar4 != 0)) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    pIVar6 = (Item *)(parent_local->key).data;
    if (pIVar6 == (Item *)0x0) break;
    bVar3 = String::operator>(key,(String *)pIVar6);
    key_local = (String *)pIVar6;
    if (bVar3) {
      parent_local = (Item *)&pIVar6->right;
    }
    else {
      bVar3 = String::operator<(key,(String *)pIVar6);
      if (!bVar3) {
        String::operator=(&pIVar6->value,value);
        Iterator::Iterator((Iterator *)&this_local,pIVar6);
        return (Iterator)(Item *)this_local;
      }
      parent_local = (Item *)&pIVar6->left;
    }
  }
  itemBlock = (ItemBlock *)this->freeItem;
  if ((Item *)itemBlock == (Item *)0x0) {
    pIVar5 = (ItemBlock *)operator_new__(0x228);
    pIVar5->next = this->blocks;
    this->blocks = pIVar5;
    for (end = (Item *)(pIVar5 + 1); end < (Item *)(pIVar5 + 0x45); end = end + 1) {
      end->prev = (Item *)itemBlock;
      itemBlock = (ItemBlock *)end;
    }
    this->freeItem = (Item *)itemBlock;
  }
  Item::Item((Item *)itemBlock,(Item *)key_local,key,value);
  this->freeItem = (Item *)itemBlock[0x10].next;
  (parent_local->key).data = (Data *)itemBlock;
  this->_size = this->_size + 1;
  if (key_local == (String *)0x0) {
    if (((this->_begin).item != &this->endItem) &&
       (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,0x1a1,"_begin.item == &endItem"), iVar4 != 0)) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    itemBlock[0x10].next = (ItemBlock *)0x0;
    itemBlock[0xf].next = (ItemBlock *)(this->_begin).item;
    (this->_begin).item = (Item *)itemBlock;
    (this->endItem).prev = (Item *)itemBlock;
  }
  else {
    if (parent_local == (Item *)&key_local[2]._data.len) {
      local_80 = (String *)key_local[3].data;
    }
    else {
      local_80 = key_local;
    }
    pIVar5 = (ItemBlock *)local_80[3]._data.str;
    itemBlock[0x10].next = pIVar5;
    if (pIVar5 == (ItemBlock *)0x0) {
      (this->_begin).item = (Item *)itemBlock;
    }
    else {
      *(ItemBlock **)(local_80[3]._data.str + 0x78) = itemBlock;
    }
    itemBlock[0xf].next = (ItemBlock *)local_80;
    local_80[3]._data.str = (char *)itemBlock;
    do {
      uVar1 = key_local[2]._data.capacity;
      Item::updateHeightAndSlope((Item *)key_local);
      pIVar6 = rebal(this,(Item *)key_local);
      if (uVar1 == pIVar6->height) break;
      key_local = &pIVar6->parent->key;
    } while ((Item *)key_local != (Item *)0x0);
  }
  Iterator::Iterator((Iterator *)&this_local,(Item *)itemBlock);
  return (Iterator)(Item *)this_local;
}

Assistant:

Iterator insert(Item** cell, Item* parent, const T& key, const V& value)
  {
  begin:
    ASSERT(!parent || cell == &parent->left || cell == &parent->right);
    Item* position = *cell;
    if(!position)
    {
      Item* item = freeItem;
      if(!item)
      {
        ItemBlock* itemBlock = (ItemBlock*)new char[sizeof(ItemBlock) + sizeof(Item) * 4];
        itemBlock->next = blocks;
        blocks = itemBlock;
        for(Item* i = (Item*)(itemBlock + 1), * end = i + 4; i < end; ++i)
        {
          i->prev = item;
          item = i;
        }
        freeItem = item;
      }

      new(item) Item(parent, key, value);
      freeItem = item->prev;

      *cell = item;
      ++_size;
      if(!parent)
      { // first item
        ASSERT(_begin.item == &endItem);
        item->prev = 0;
        item->next = _begin.item;
        _begin.item = item;
        endItem.prev = item;
      }
      else
      {
        Item* insertPos = cell == &parent->right ? 
          parent->next : // insert after parent
          parent; // insert before parent
        if((item->prev = insertPos->prev))
          insertPos->prev->next = item;
        else
          _begin.item = item;
        item->next = insertPos;
        insertPos->prev = item;

        // neu:
        usize oldHeight;
        do
        {
          oldHeight = parent->height;
          parent->updateHeightAndSlope();
          parent = rebal(parent);
          if(oldHeight == parent->height)
            break;
          parent = parent->parent;
        } while(parent);
      }
      return item;
    }
    else
    {
      if(key > position->key)
      {
        cell = &position->right;
        parent = position;
        goto begin;
      }
      else if(key < position->key)
      {
        cell = &position->left;
        parent = position;
        goto begin;
      }
      else
      {
        position->value = value;
        return position;
      }
    }
  }